

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.cpp
# Opt level: O0

void __thiscall CGrid::Print(CGrid *this,FILE *pFile,int iMode)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  CLayer *pCVar14;
  reference ppCVar15;
  char *local_210;
  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_> local_30;
  iterator end;
  iterator itr;
  int iMode_local;
  FILE *pFile_local;
  CGrid *this_local;
  
  if (pFile != (FILE *)0x0) {
    if (iMode == 0) {
      uVar10 = CPoint::X((CPoint *)this);
      uVar11 = CPoint::Y((CPoint *)this);
      uVar12 = CPoint::Z((CPoint *)this);
      fprintf((FILE *)pFile,"grid(%d,%d,%d) 0x%x\n",(ulong)uVar10,(ulong)uVar11,(ulong)uVar12,this);
      uVar10 = CPoint::X((CPoint *)this);
      uVar11 = CPoint::Y((CPoint *)this);
      uVar12 = CPoint::Z((CPoint *)this);
      uVar13 = CBoundary::GetCapacity(&this->super_CBoundary,0x2000);
      iVar9 = CBoundary::GetCapacity(&this->super_CBoundary,0x1000);
      pCVar14 = GetParent(this);
      iVar2 = CLayer::GetCapacity(pCVar14,0x40);
      iVar3 = CBoundary::GetOverFlow(&this->super_CBoundary);
      fprintf((FILE *)pFile,"bnd(%d,%d,%d): ocu_cap:%d\tavb_cap:%d\tmax_cap:%d\toverflow:%d\n",
              (ulong)uVar10,(ulong)uVar11,(ulong)uVar12,(ulong)uVar13,iVar9,iVar2,iVar3);
      end = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&(this->super_CBoundary).m_Wire);
      local_30._M_current =
           (CWire **)
           std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&(this->super_CBoundary).m_Wire);
      while (bVar1 = __gnu_cxx::operator!=(&end,&local_30), bVar1) {
        ppCVar15 = __gnu_cxx::
                   __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                   operator*(&end);
        (*((*ppCVar15)->super_CObject)._vptr_CObject[2])(*ppCVar15,pFile,0);
        __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
        operator++(&end);
      }
    }
    else if (iMode == 1) {
      iVar9 = CPoint::X((CPoint *)this);
      iVar2 = CPoint::X((CPoint *)this);
      iVar3 = CPoint::Y((CPoint *)this);
      iVar4 = CPoint::Y((CPoint *)this);
      fprintf((FILE *)pFile,"plot([%.1f,%.1f],[%.1f,%.1f],\'%s\');\n",(double)iVar9 - 0.5,
              (double)iVar2 + 0.5,(double)iVar3 - 0.5,(double)iVar4 - 0.5,"-r");
      iVar9 = CPoint::X((CPoint *)this);
      iVar2 = CPoint::X((CPoint *)this);
      iVar3 = CPoint::Y((CPoint *)this);
      iVar4 = CPoint::Y((CPoint *)this);
      fprintf((FILE *)pFile,"plot([%.2f,%.2f],[%.2f,%.2f],\'%s\');\n",(double)iVar9 - 0.5,
              (double)iVar2 - 0.5,(double)iVar3 - 0.5,(double)iVar4 + 0.5,"-r");
    }
    else if (iMode == 0x80) {
      iVar9 = CPoint::X((CPoint *)this);
      iVar2 = CPoint::X((CPoint *)this);
      iVar3 = CPoint::Y((CPoint *)this);
      iVar4 = CPoint::Y((CPoint *)this);
      uVar10 = CPoint::Z((CPoint *)this);
      uVar11 = CPoint::Z((CPoint *)this);
      fprintf((FILE *)pFile,"plot3([%.1f,%.1f],[%.1f,%.1f],[%d,%d],\'%s\');\n",(double)iVar9 - 0.5,
              (double)iVar2 + 0.5,(double)iVar3 - 0.5,(double)iVar4 - 0.5,(ulong)uVar10,
              (ulong)uVar11,"-r");
      iVar9 = CPoint::X((CPoint *)this);
      iVar2 = CPoint::X((CPoint *)this);
      iVar3 = CPoint::Y((CPoint *)this);
      iVar4 = CPoint::Y((CPoint *)this);
      uVar10 = CPoint::Z((CPoint *)this);
      uVar11 = CPoint::Z((CPoint *)this);
      fprintf((FILE *)pFile,"plot3([%.2f,%.2f],[%.2f,%.2f],[%d,%d],\'%s\');\n",(double)iVar9 - 0.5,
              (double)iVar2 - 0.5,(double)iVar3 - 0.5,(double)iVar4 + 0.5,(ulong)uVar10,
              (ulong)uVar11,"-r");
      iVar9 = CPoint::Z((CPoint *)this);
      if (iVar9 == 1) {
        iVar9 = CPoint::X((CPoint *)this);
        iVar2 = CPoint::X((CPoint *)this);
        iVar3 = CPoint::Y((CPoint *)this);
        iVar4 = CPoint::Y((CPoint *)this);
        fprintf((FILE *)pFile,"plot3([%.1f,%.1f],[%.1f,%.1f],[%d,%d],\'%s\');\n",(double)iVar9 - 0.5
                ,(double)iVar2 + 0.5,(double)iVar3 - 0.5,(double)iVar4 - 0.5,0,0,"-r");
        iVar9 = CPoint::X((CPoint *)this);
        iVar2 = CPoint::X((CPoint *)this);
        iVar3 = CPoint::Y((CPoint *)this);
        iVar4 = CPoint::Y((CPoint *)this);
        fprintf((FILE *)pFile,"plot3([%.2f,%.2f],[%.2f,%.2f],[%d,%d],\'%s\');\n",(double)iVar9 - 0.5
                ,(double)iVar2 - 0.5,(double)iVar3 - 0.5,(double)iVar4 + 0.5,0,0,"-r");
      }
    }
    else if (iMode == 0x100) {
      iVar9 = CPoint::X((CPoint *)this);
      iVar2 = CPoint::Y((CPoint *)this);
      iVar3 = CPoint::X((CPoint *)this);
      iVar4 = CPoint::Y((CPoint *)this);
      iVar5 = CPoint::X((CPoint *)this);
      iVar6 = CPoint::Y((CPoint *)this);
      iVar7 = CPoint::X((CPoint *)this);
      iVar8 = CPoint::Y((CPoint *)this);
      fprintf((FILE *)pFile,
              "plot \'-\' w lines lt 1\n %.1f %.1f\n %.1f %.1f\n\n %.1f %.1f\n %.1f %.1f\ne\n",
              (double)iVar9 - 0.5,(double)iVar2 - 0.5,(double)iVar3 + 0.5,(double)iVar4 - 0.5,
              (double)iVar5 - 0.5,(double)iVar6 - 0.5,(double)iVar7 - 0.5,(double)iVar8 + 0.5);
    }
    else if (iMode == 0x200) {
      iVar9 = CPoint::X((CPoint *)this);
      iVar2 = CPoint::Y((CPoint *)this);
      uVar10 = CPoint::Z((CPoint *)this);
      iVar3 = CPoint::X((CPoint *)this);
      iVar4 = CPoint::Y((CPoint *)this);
      uVar11 = CPoint::Z((CPoint *)this);
      iVar5 = CPoint::X((CPoint *)this);
      iVar6 = CPoint::Y((CPoint *)this);
      uVar12 = CPoint::Z((CPoint *)this);
      iVar7 = CPoint::X((CPoint *)this);
      iVar8 = CPoint::Y((CPoint *)this);
      uVar13 = CPoint::Z((CPoint *)this);
      fprintf((FILE *)pFile,
              "splot \'-\' w lines lt 1\n %.1f %.1f %d\n %.1f %.1f %d\n\n %.1f %.1f %d\n %.1f %.1f %d\ne\n"
              ,(double)iVar9 - 0.5,(double)iVar2 - 0.5,(double)iVar3 + 0.5,(double)iVar4 - 0.5,
              (double)iVar5 - 0.5,(double)iVar6 - 0.5,(double)iVar7 - 0.5,(double)iVar8 + 0.5,
              (ulong)uVar10,(ulong)uVar11,(ulong)uVar12,(ulong)uVar13);
      iVar9 = CPoint::Z((CPoint *)this);
      if (iVar9 == 1) {
        iVar9 = CPoint::X((CPoint *)this);
        iVar2 = CPoint::Y((CPoint *)this);
        iVar3 = CPoint::X((CPoint *)this);
        iVar4 = CPoint::Y((CPoint *)this);
        iVar5 = CPoint::X((CPoint *)this);
        iVar6 = CPoint::Y((CPoint *)this);
        iVar7 = CPoint::X((CPoint *)this);
        iVar8 = CPoint::Y((CPoint *)this);
        fprintf((FILE *)pFile,
                "splot \'-\' w lines lt 1\n %.1f %.1f %d\n %.1f %.1f %d\n\n %.1f %.1f %d\n %.1f %.1f %d\ne\n"
                ,(double)iVar9 - 0.5,(double)iVar2 - 0.5,(double)iVar3 + 0.5,(double)iVar4 - 0.5,
                (double)iVar5 - 0.5,(double)iVar6 - 0.5,(double)iVar7 - 0.5,(double)iVar8 + 0.5,0,0,
                0);
      }
    }
    else if (iMode == 0x400) {
      iVar9 = CBoundary::GetOverFlow(&this->super_CBoundary);
      if (iVar9 != 0) {
        uVar10 = CPoint::X((CPoint *)this);
        uVar11 = CPoint::Y((CPoint *)this);
        uVar12 = CPoint::Z((CPoint *)this);
        uVar13 = CBoundary::GetOverFlow(&this->super_CBoundary);
        iVar9 = CBoundary::GetPenalty(&this->super_CBoundary);
        fprintf((FILE *)pFile,"bnd(%d,%d,%d): %d OF -%d\n",(ulong)uVar10,(ulong)uVar11,(ulong)uVar12
                ,(ulong)uVar13,iVar9);
      }
    }
    else {
      if (iMode != 0x800) {
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Grid.cpp"
                      ,0x103,"virtual void CGrid::Print(FILE *, int)");
      }
      pCVar14 = GetParent(this);
      iVar9 = CLayer::IsHorizontal(pCVar14);
      if (iVar9 == 0) {
        local_210 = "V";
      }
      else {
        local_210 = "H";
      }
      uVar10 = CPoint::X((CPoint *)this);
      uVar11 = CPoint::Y((CPoint *)this);
      uVar12 = CPoint::Z((CPoint *)this);
      iVar9 = CBoundary::GetCongestion(&this->super_CBoundary);
      fprintf((FILE *)pFile,"%s(%3d,%3d,%3d) %.2f\t",(double)iVar9 / 100.0,local_210,(ulong)uVar10,
              (ulong)uVar11,(ulong)uVar12);
    }
    fflush((FILE *)pFile);
  }
  return;
}

Assistant:

void CGrid::Print(FILE *pFile, int iMode)
{
	if(pFile==NULL)	return;

	switch(iMode) {
	case PRINT_MODE_GNUPLOT:
		fprintf(pFile,"plot '-' w lines lt 1\n %.1f %.1f\n %.1f %.1f\n\n %.1f %.1f\n %.1f %.1f\ne\n",
			X()-0.5,Y()-0.5,
			X()+0.5,Y()-0.5,
			X()-0.5,Y()-0.5,
			X()-0.5,Y()+0.5);
		break;
	case PRINT_MODE_GNUPLOT3D:
		fprintf(pFile,"splot '-' w lines lt 1\n %.1f %.1f %d\n %.1f %.1f %d\n\n %.1f %.1f %d\n %.1f %.1f %d\ne\n",
			X()-0.5,Y()-0.5,Z(),
			X()+0.5,Y()-0.5,Z(),
			X()-0.5,Y()-0.5,Z(),
			X()-0.5,Y()+0.5,Z());
		if(Z()==1)
		{
			fprintf(pFile,"splot '-' w lines lt 1\n %.1f %.1f %d\n %.1f %.1f %d\n\n %.1f %.1f %d\n %.1f %.1f %d\ne\n",
				X()-0.5,Y()-0.5,0,
				X()+0.5,Y()-0.5,0,
				X()-0.5,Y()-0.5,0,
				X()-0.5,Y()+0.5,0);
		}		
		break;
	case PRINT_MODE_MATLAB:
		fprintf(pFile,"plot([%.1f,%.1f],[%.1f,%.1f],'%s');\n",
			X()-0.5,X()+0.5,
			Y()-0.5,Y()-0.5,
			"-r");
		fprintf(pFile,"plot([%.2f,%.2f],[%.2f,%.2f],'%s');\n",
			X()-0.5,X()-0.5,
			Y()-0.5,Y()+0.5,
			"-r");
		break;
	case PRINT_MODE_MATLAB3D:
		fprintf(pFile,"plot3([%.1f,%.1f],[%.1f,%.1f],[%d,%d],'%s');\n",
			X()-0.5,X()+0.5,
			Y()-0.5,Y()-0.5,
			Z(),Z(),
			"-r");
		fprintf(pFile,"plot3([%.2f,%.2f],[%.2f,%.2f],[%d,%d],'%s');\n",
			X()-0.5,X()-0.5,
			Y()-0.5,Y()+0.5,
			Z(),Z(),
			"-r");
		if(Z()==1)
		{
			fprintf(pFile,"plot3([%.1f,%.1f],[%.1f,%.1f],[%d,%d],'%s');\n",
				X()-0.5,X()+0.5,
				Y()-0.5,Y()-0.5,
				0,0,
				"-r");
			fprintf(pFile,"plot3([%.2f,%.2f],[%.2f,%.2f],[%d,%d],'%s');\n",
				X()-0.5,X()-0.5,
				Y()-0.5,Y()+0.5,
				0,0,
				"-r");
		}
		break;
	case PRINT_MODE_CGDUMP:
		fprintf(pFile,"%s(%3d,%3d,%3d) %.2f\t",GetParent()->IsHorizontal()? "H":"V",X(),Y(),Z(),GetCongestion()/100.0);
		break;
	//case PRINT_MODE_RESULT:
	//	fprintf(pFile,"b %d %d %d\t%d\n",X(),Y(),Z(),GetNumWire(GET_MODE_SPECIAL));
	//	break;
	case PRINT_MODE_OFDUMP:
		if(GetOverFlow())
		{
			fprintf(pFile,"bnd(%d,%d,%d): %d OF -%d\n",
				X(),Y(),Z(),GetOverFlow(),GetPenalty());
		}
		break;
	case PRINT_MODE_TEXT:
		{
#ifdef _DEBUG
			fprintf(pFile,"grid(%d,%d,%d)\n",X(),Y(),Z());
#else
			fprintf(pFile,"grid(%d,%d,%d) 0x%x\n",X(),Y(),Z(),this);
#endif
			
			fprintf(pFile,"bnd(%d,%d,%d): ocu_cap:%d\tavb_cap:%d\tmax_cap:%d\toverflow:%d\n",
				X(),Y(),Z(),
				GetCapacity(GET_MODE_OCAP),
				GetCapacity(GET_MODE_ACAP),
				GetParent()->GetCapacity(GET_MODE_MAX),
				GetOverFlow());

			for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)	(*itr)->Print(pFile,iMode);
		}
		break;
	default:
		assert(FALSE);
		break;
	}
	fflush(pFile);
}